

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O1

optional<webfront::fs::File> * __thiscall
webfront::fs::
Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::ReactFS,webfront::fs::BabelFS>
::openFile<webfront::fs::ReactFS,webfront::fs::BabelFS>
          (optional<webfront::fs::File> *__return_storage_ptr__,void *this,path *filename)

{
  optional<webfront::fs::File> file;
  path local_2d0;
  path local_2a8;
  _Optional_payload_base<webfront::fs::File> local_280;
  
  http::std::filesystem::__cxx11::path::path(&local_2a8,filename);
  ReactFS::open((char *)&local_280,(int)&local_2a8);
  http::std::filesystem::__cxx11::path::~path(&local_2a8);
  if (local_280._M_engaged == true) {
    (__return_storage_ptr__->super__Optional_base<webfront::fs::File,_false,_false>)._M_payload.
    super__Optional_payload<webfront::fs::File,_true,_false,_false>.
    super__Optional_payload_base<webfront::fs::File>._M_engaged = false;
    http::std::_Optional_payload_base<webfront::fs::File>::_M_construct<webfront::fs::File>
              ((_Optional_payload_base<webfront::fs::File> *)__return_storage_ptr__,
               (File *)&local_280);
  }
  else {
    http::std::filesystem::__cxx11::path::path(&local_2d0,filename);
    Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>
    ::openFile<webfront::fs::BabelFS>
              (__return_storage_ptr__,
               (Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>
                *)this,&local_2d0);
    http::std::filesystem::__cxx11::path::~path(&local_2d0);
  }
  if (local_280._M_engaged == true) {
    http::std::_Optional_payload_base<webfront::fs::File>::_M_destroy(&local_280);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<File> openFile(std::filesystem::path filename) {
        auto file = this->First::open(filename);
        if constexpr (sizeof...(Rest) == 0) return file;
        else {
            if (file.has_value()) return file;
            return openFile<Rest...>(filename);
        }
    }